

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap3-gui.cpp
# Opt level: O2

bool renderKeyPresses(stStateUI *stateUI,TWaveform *waveform,TKeyPressCollection *keyPresses)

{
  int *v;
  float *v_00;
  float *v_01;
  int32_t *v_02;
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer psVar4;
  pointer psVar5;
  long lVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  ImVec2 graph_size;
  ImVec2 graph_size_00;
  ImVec2 graph_size_01;
  ImVec2 graph_size_02;
  byte bVar9;
  bool bVar10;
  ImU32 IVar11;
  int iVar12;
  ImGuiIO *pIVar13;
  ImDrawList *pIVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  pointer psVar18;
  ulong uVar19;
  int32_t *v_03;
  const_iterator __position;
  pointer psVar20;
  int *v_04;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int i;
  uint __val;
  long lVar25;
  float fVar26;
  float fVar27;
  ImVec2 IVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  ImVec2 wsize;
  ImVec2 savePos;
  ImVec2 p1;
  ImVec2 p0;
  byte local_114;
  float local_e8;
  float fStack_e4;
  stWaveformView<short> tview;
  ImVec2 local_90;
  float local_84;
  float local_80;
  float local_7c;
  ImVec2 savePos2;
  float local_58;
  stWaveformView<short> wview;
  
  v = &stateUI->nview;
  v_04 = &stateUI->offset;
  iVar12 = stateUI->nview;
  if (iVar12 < 0) {
    iVar12 = (int)((ulong)((long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                _M_impl.super__Vector_impl_data._M_start) >> 1);
    *v = iVar12;
  }
  if (*v_04 < 0) {
    *v_04 = (int)(((ulong)((long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                _M_impl.super__Vector_impl_data._M_start) >> 1) - (long)iVar12 >> 1)
    ;
  }
  iVar16 = (int)((ulong)((long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 1);
  if ((stateUI->scrolling == false & iVar12 < 0x80000 & stateUI->recording) == 1) {
    iVar12 = 0x80000;
    if (iVar16 < 0x80000) {
      iVar12 = iVar16;
    }
    *v = iVar12;
  }
  if (stateUI->lastSize != iVar16) {
    stateUI->viewMax = iVar16;
    stateUI->lastSize = iVar16;
    stateUI->nviewPrev = iVar12 + 1;
    if (stateUI->scrolling == false) {
      *v_04 = iVar16 - iVar12;
    }
  }
  tview.samples = (short *)((ulong)(uint)stateUI->windowHeightTitleBar << 0x20);
  wview.samples = (short *)0x0;
  ImGui::SetNextWindowPos((ImVec2 *)&tview,2,(ImVec2 *)&wview);
  fVar26 = stateUI->windowHeightKeyPesses;
  if ((fVar26 != 0.0) || (NAN(fVar26))) {
    tview.samples = (short *)CONCAT44(fVar26,(float)g_windowSizeX);
  }
  else {
    tview.samples = (short *)CONCAT44(0x437a0000,(float)g_windowSizeX);
  }
  ImGui::SetNextWindowSize((ImVec2 *)&tview,1);
  bVar10 = ImGui::Begin("Key Presses",(bool *)0x0,4);
  if (bVar10) {
    IVar7 = ImGui::GetContentRegionAvail();
    IVar8 = ImGui::GetContentRegionAvail();
    fVar26 = ImGui::GetTextLineHeightWithSpacing();
    local_e8 = IVar7.x;
    wsize.y = fVar26 * -3.0 + IVar8.y;
    wsize.x = local_e8;
    iVar12 = stateUI->nview;
    if (iVar12 != stateUI->nviewPrev) {
      local_e8 = (float)iVar12 / local_e8;
      if (local_e8 <= 1.0) {
        local_e8 = 1.0;
      }
      generateLowResWaveform<short>(waveform,&stateUI->waveformLowRes,(int)local_e8);
      iVar12 = stateUI->nview;
      stateUI->nviewPrev = iVar12;
    }
    v_00 = &stateUI->amin;
    v_01 = &stateUI->amax;
    wview.samples =
         (stateUI->waveformLowRes).super__Vector_base<short,_std::allocator<short>_>._M_impl.
         super__Vector_impl_data._M_start + stateUI->offset;
    wview.n = (int64_t)iVar12;
    pIVar13 = ImGui::GetIO();
    fVar26 = (pIVar13->MousePos).x;
    fVar1 = (pIVar13->MousePos).y;
    savePos = ImGui::GetCursorScreenPos();
    pIVar14 = ImGui::GetWindowDrawList();
    tview.samples = (short *)0x3e99999a3e99999a;
    tview.n = 0x3e99999a3e99999a;
    ImGui::PushStyleColor(7,(ImVec4 *)&tview);
    tview.samples = (short *)0x3f8000003f800000;
    tview.n = 0x3f8000003f800000;
    ImGui::PushStyleColor(0x28,(ImVec4 *)&tview);
    IVar7.y = wsize.y;
    IVar7.x = wsize.x;
    ImGui::PlotHistogram
              ("##Waveform",plotWaveform,&wview,stateUI->nview,0,"Waveform",stateUI->amin,
               stateUI->amax,IVar7);
    ImGui::PopStyleColor(2);
    ImGui::SetCursorScreenPos(&savePos);
    tview.samples = (short *)0x3dcccccd3dcccccd;
    tview.n = 0x3dcccccd;
    ImGui::PushStyleColor(7,(ImVec4 *)&tview);
    tview.samples = (short *)0x3f8000003f800000;
    tview.n = 0x3f8000003f800000;
    ImGui::PushStyleColor(0x28,(ImVec4 *)&tview);
    IVar8.y = wsize.y;
    IVar8.x = wsize.x;
    ImGui::PlotHistogram
              ("##Waveform",plotWaveformInverse,&wview,stateUI->nview,0,"Waveform",stateUI->amin,
               stateUI->amax,IVar8);
    ImGui::PopStyleColor(2);
    lVar17 = (long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                   super__Vector_impl_data._M_start;
    psVar4 = (stateUI->waveformThreshold).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((lVar17 == (long)(stateUI->waveformThreshold).
                         super__Vector_base<short,_std::allocator<short>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)psVar4) &&
       (psVar5 = (stateUI->waveformMax).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                 super__Vector_impl_data._M_start,
       lVar17 == (long)(stateUI->waveformMax).super__Vector_base<short,_std::allocator<short>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)psVar5)) {
      tview.n = (int64_t)*v;
      tview.samples = psVar4 + *v_04;
      savePos2 = (ImVec2)(psVar5 + *v_04);
      ImGui::SetCursorScreenPos(&savePos);
      p0.x = 0.0;
      p0.y = 0.0;
      ImGui::PushStyleColor(7,(ImVec4 *)&p0);
      p0.x = 1.0;
      p0.y = 1.0;
      ImGui::PushStyleColor(0x26,(ImVec4 *)&p0);
      graph_size.y = wsize.y;
      graph_size.x = wsize.x;
      ImGui::PlotLines("##WaveformThreshold",plotWaveform,&tview,*v,0,"",*v_00,*v_01,graph_size);
      ImGui::PopStyleColor(2);
      ImGui::SetCursorScreenPos(&savePos);
      p0.x = 0.0;
      p0.y = 0.0;
      ImGui::PushStyleColor(7,(ImVec4 *)&p0);
      p0.x = 1.0;
      p0.y = 1.0;
      ImGui::PushStyleColor(0x26,(ImVec4 *)&p0);
      graph_size_00.y = wsize.y;
      graph_size_00.x = wsize.x;
      ImGui::PlotLines("##WaveformThreshold",plotWaveformInverse,&tview,*v,0,"",*v_00,*v_01,
                       graph_size_00);
      ImGui::PopStyleColor(2);
      ImGui::SetCursorScreenPos(&savePos);
      p0.x = 0.0;
      p0.y = 0.0;
      ImGui::PushStyleColor(7,(ImVec4 *)&p0);
      p0.x = 0.0;
      p0.y = 1.0;
      ImGui::PushStyleColor(0x26,(ImVec4 *)&p0);
      graph_size_01.y = wsize.y;
      graph_size_01.x = wsize.x;
      ImGui::PlotLines("##WaveformMax",plotWaveform,&savePos2,*v,0,"",*v_00,*v_01,graph_size_01);
      ImGui::PopStyleColor(2);
      ImGui::SetCursorScreenPos(&savePos);
      p0.x = 0.0;
      p0.y = 0.0;
      ImGui::PushStyleColor(7,(ImVec4 *)&p0);
      p0.x = 0.0;
      p0.y = 1.0;
      ImGui::PushStyleColor(0x26,(ImVec4 *)&p0);
      graph_size_02.y = wsize.y;
      graph_size_02.x = wsize.x;
      ImGui::PlotLines("##WaveformMax",plotWaveformInverse,&savePos2,*v,0,"",*v_00,*v_01,
                       graph_size_02);
      ImGui::PopStyleColor(2);
    }
    ImGui::SetCursorScreenPos(&savePos);
    ImGui::InvisibleButton("##WaveformIB",&wsize);
    bVar10 = ImGui::IsItemHovered(0);
    local_114 = 1;
    if (bVar10) {
      pIVar13 = ImGui::GetIO();
      fVar29 = pIVar13->MouseWheel;
      iVar12 = stateUI->nview;
      iVar16 = (int)((float)iVar12 * ((fVar29 + 10.0) / 10.0));
      if (iVar16 < stateUI->viewMin) {
        iVar16 = stateUI->viewMin;
      }
      if (stateUI->viewMax < iVar16) {
        iVar16 = stateUI->viewMax;
      }
      stateUI->nview = iVar16;
      if ((fVar29 != 0.0) || (NAN(fVar29))) {
        fVar29 = (float)(iVar12 - iVar16) * ((fVar26 - savePos.x) / wsize.x) + (float)*v_04;
        if (fVar29 <= 0.0) {
          fVar29 = 0.0;
        }
        *v_04 = (int)fVar29;
      }
      bVar10 = ImGui::IsMouseDown(0);
      if ((bVar10) && (bVar10 = ImGui::IsMouseDragging(0,-1.0), !bVar10)) {
        stateUI->dragOffset = (float)stateUI->offset;
      }
      bVar10 = ImGui::IsMouseDragging(0,-1.0);
      if (bVar10) {
        fVar29 = stateUI->dragOffset;
        IVar7 = ImGui::GetMouseDragDelta(0,-1.0);
        stateUI->offset = (int)(fVar29 - ((float)stateUI->nview * IVar7.x) / wsize.x);
      }
      bVar10 = ImGui::IsMouseReleased(0);
      if (((bVar10) && (pIVar13 = ImGui::GetIO(), pIVar13->KeyCtrl != false)) ||
         (bVar10 = ImGui::IsMouseDoubleClicked(0), bVar10)) {
        lVar17 = (long)(((fVar26 - savePos.x) * (float)stateUI->nview) / wsize.x +
                       (float)stateUI->offset);
        __position._M_current =
             (keyPresses->
             super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
             super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
        uVar15 = ((long)(keyPresses->
                        super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                        ).
                        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)__position._M_current) /
                 0x30;
        lVar22 = (long)(stateUI->params).keyPressWidth_samples;
        uVar21 = 0;
        iVar12 = (int)uVar15;
        uVar19 = 0;
        if (0 < iVar12) {
          uVar19 = uVar15 & 0xffffffff;
        }
        for (; uVar19 != uVar21; uVar21 = uVar21 + 1) {
          lVar6 = (__position._M_current)->pos;
          lVar24 = lVar6 + (stateUI->params).offsetFromPeak_samples;
          lVar23 = lVar24 - lVar22;
          lVar24 = lVar24 + lVar22;
          lVar25 = lVar6;
          if (lVar23 < lVar6) {
            lVar25 = lVar23;
          }
          if (lVar24 < lVar25) {
            lVar25 = lVar24;
          }
          if (lVar17 < lVar25) {
            tview.samples =
                 (waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                 super__Vector_impl_data._M_start;
            tview.n = (long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)tview.samples >> 1;
            std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::insert
                      (&keyPresses->
                        super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                       ,__position,(value_type *)&tview);
            local_114 = 0;
            goto LAB_0013fba5;
          }
          if (lVar23 < lVar6) {
            lVar23 = lVar6;
          }
          if (lVar23 <= lVar24) {
            lVar23 = lVar24;
          }
          if (lVar17 <= lVar23) {
            uVar19 = uVar21 & 0xffffffff;
            break;
          }
          __position._M_current = __position._M_current + 1;
        }
        if ((int)uVar19 == iVar12) {
          tview.samples =
               (waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
               super__Vector_impl_data._M_start;
          tview.n = (long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)tview.samples >> 1;
          std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::push_back
                    (&keyPresses->
                      super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>,
                     (value_type *)&tview);
          local_114 = 0;
        }
      }
    }
LAB_0013fba5:
    bVar10 = ImGui::BeginPopupContextWindow((char *)0x0,1,true);
    if (bVar10) {
      ImGui::SliderInt("View  ",v,stateUI->viewMin,stateUI->viewMax,"%d");
      ImGui::DragInt("Offset",v_04,(float)stateUI->nview * 0.01,0,
                     (int)((ulong)((long)(waveform->
                                         super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)(waveform->super__Vector_base<short,_std::allocator<short>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 1) -
                     stateUI->nview,"%d");
      ImGui::SliderFloat("Amplitude Min",v_00,-32000.0,0.0,"%.3f",1.0);
      ImGui::SliderFloat("Amplitude Max",v_01,0.0,32000.0,"%.3f",1.0);
      ImGui::EndPopup();
    }
    tview.samples = (short *)CONCAT44(stateUI->scrollSize,wsize.x);
    ImGui::InvisibleButton("##WaveformScrollIB",(ImVec2 *)&tview);
    savePos2.y = savePos.y + wsize.y;
    savePos2.x = savePos.x;
    p0.x = wsize.x + savePos.x;
    p0.y = stateUI->scrollSize + savePos.y + wsize.y;
    tview.samples = (short *)0x3f8000003f800000;
    tview.n = 0x3f8000003f800000;
    IVar11 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)&tview);
    ImDrawList::AddRect(pIVar14,&savePos2,&p0,IVar11,0.0,0xf,1.0);
    uVar2 = stateUI->nview;
    uVar3 = stateUI->offset;
    fVar29 = wsize.y + savePos.y;
    savePos2.y = fVar29;
    savePos2.x = (wsize.x * (float)(int)uVar3) / (float)stateUI->viewMax + savePos.x;
    p0.y = stateUI->scrollSize + fVar29;
    p0.x = (((float)(int)uVar3 + (float)(int)uVar2) * wsize.x) / (float)stateUI->viewMax + savePos.x
    ;
    tview.samples = (short *)0x3f8000003f800000;
    tview.n = 0x3f8000003f800000;
    IVar11 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)&tview);
    ImDrawList::AddRectFilled(pIVar14,&savePos2,&p0,IVar11,0.0,0xf);
    savePos2 = ImGui::GetCursorScreenPos();
    bVar10 = ImGui::IsItemHovered(0);
    if ((bVar10) && (bVar10 = ImGui::IsMouseDown(0), bVar10)) {
      stateUI->scrolling = true;
    }
    if (stateUI->scrolling == true) {
      stateUI->offset =
           (int)((float)stateUI->viewMax * ((fVar26 - savePos.x) / wsize.x) -
                (float)(stateUI->nview / 2));
    }
    bVar10 = ImGui::IsMouseDown(0);
    if (!bVar10) {
      stateUI->scrolling = false;
    }
    iVar12 = (int)((ulong)((long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(waveform->super__Vector_base<short,_std::allocator<short>_>).
                                _M_impl.super__Vector_impl_data._M_start) >> 1) - stateUI->nview;
    if (stateUI->offset <= iVar12) {
      iVar12 = stateUI->offset;
    }
    if (iVar12 < 1) {
      iVar12 = 0;
    }
    stateUI->offset = iVar12;
    v_02 = &(stateUI->params).offsetFromPeak_samples;
    v_03 = &(stateUI->params).keyPressWidth_samples;
    __val = 0;
    while( true ) {
      psVar20 = (keyPresses->
                super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      psVar18 = (keyPresses->
                super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((int)(((long)psVar18 - (long)psVar20) / 0x30) <= (int)__val) break;
      lVar17 = (long)*v_02 + psVar20[(int)__val].pos;
      iVar12 = *v_04;
      if ((long)iVar12 <= lVar17 + *v_03) {
        if ((long)(*v + iVar12) <= lVar17 - *v_03) break;
        p0.x = ((float)(psVar20[(int)__val].pos - (long)iVar12) / (float)*v) * wsize.x + savePos.x;
        p0.y = savePos.y;
        p1.y = savePos.y + wsize.y;
        p1.x = p0.x;
        tview.samples = (short *)0x3f800000;
        tview.n = 0x3f4ccccd00000000;
        IVar11 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)&tview);
        ImDrawList::AddLine(pIVar14,&p0,&p1,IVar11,1.0);
        lVar17 = (keyPresses->
                 super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                 super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[(int)__val].pos;
        lVar22 = (long)*v_04;
        lVar24 = *v_02 + lVar17;
        fVar29 = (float)*v;
        fVar30 = (float)(lVar24 - (*v_03 + lVar22)) / fVar29;
        fVar31 = (float)((*v_03 - lVar22) + lVar24) / fVar29;
        fVar27 = ((float)(lVar17 - lVar22) / fVar29) * wsize.x + savePos.x;
        p0.x = fVar30 * wsize.x + savePos.x;
        p0.y = savePos.y;
        p1.x = wsize.x * fVar31 + savePos.x;
        fVar33 = wsize.y + savePos.y;
        p1.y = fVar33;
        fVar29 = p0.x;
        if (fVar27 <= p0.x) {
          fVar29 = fVar27;
        }
        fVar32 = p1.x;
        if (fVar29 <= p1.x) {
          fVar32 = fVar29;
        }
        if (fVar26 <= fVar32) {
LAB_0014010d:
          tview.samples = (short *)0x3f800000;
          tview.n = 0x3e99999a00000000;
          IVar11 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)&tview);
          ImDrawList::AddRectFilled(pIVar14,&p0,&p1,IVar11,0.0,0xf);
        }
        else {
          fVar29 = p0.x;
          if (p0.x <= fVar27) {
            fVar29 = fVar27;
          }
          fVar27 = p1.x;
          if (p1.x <= fVar29) {
            fVar27 = fVar29;
          }
          if ((fVar27 <= fVar26) || (fVar1 <= savePos.y)) goto LAB_0014010d;
          tview.samples = (short *)0x3f800000;
          tview.n = (ulong)*(uint *)(&DAT_0019a238 + (ulong)(fVar1 < fVar33) * 4) << 0x20;
          IVar11 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)&tview);
          ImDrawList::AddRectFilled(pIVar14,&p0,&p1,IVar11,0.0,0xf);
          if (fVar1 < fVar33) {
            bVar10 = ImGui::IsMouseReleased(0);
            if ((!bVar10) ||
               (pIVar13 = ImGui::GetIO(), bVar9 = local_114, pIVar13->KeyCtrl == false)) {
              bVar10 = ImGui::IsMouseDoubleClicked(0);
              bVar9 = local_114 & bVar10;
            }
            if (bVar9 != 0) {
              std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::erase
                        (&keyPresses->
                          super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         ,(keyPresses->
                          super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                          ).
                          super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (int)__val);
              __val = __val - 1;
            }
          }
        }
        fVar29 = wsize.x;
        iVar12 = *v;
        if ((float)iVar12 < wsize.x * 64.0) {
          local_7c = savePos.x;
          std::__cxx11::to_string((string *)&tview,__val);
          IVar7 = ImGui::CalcTextSize((char *)tview.samples,(char *)0x0,false,-1.0);
          local_80 = savePos.y;
          local_84 = wsize.y;
          fVar27 = ImGui::GetTextLineHeightWithSpacing();
          local_58 = IVar7.x;
          local_90.y = (local_80 + local_84) - fVar27;
          local_90.x = ((fVar30 + fVar31) * fVar29 - local_58) * 0.5 + local_7c;
          ImGui::SetCursorScreenPos(&local_90);
          std::__cxx11::string::~string((string *)&tview);
          ImGui::Text("%d",(ulong)__val);
          iVar12 = *v;
        }
        p0.x = ((float)((g_playbackData.idx + g_playbackData.offset) - (long)*v_04) / (float)iVar12)
               * wsize.x + savePos.x;
        p0.y = savePos.y;
        p1.y = savePos.y + wsize.y;
        p1.x = p0.x;
        tview.samples = (short *)0x3f8000003f800000;
        tview.n = 0x3e99999a00000000;
        IVar11 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)&tview);
        ImDrawList::AddLine(pIVar14,&p0,&p1,IVar11,1.0);
      }
      __val = __val + 1;
    }
    lVar17 = 0x10;
    for (lVar22 = 0; lVar22 < (int)(((long)psVar18 - (long)psVar20) / 0x30); lVar22 = lVar22 + 1) {
      p0.x = ((float)*(long *)((long)&(psVar20->waveform).samples + lVar17) /
             (float)stateUI->viewMax) * wsize.x + savePos.x;
      p0.y = savePos.y + wsize.y;
      p1.y = savePos.y + wsize.y + stateUI->scrollSize;
      p1.x = p0.x;
      tview.samples = (short *)0x3f800000;
      tview.n = 0x3e99999a00000000;
      IVar11 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)&tview);
      ImDrawList::AddLine(pIVar14,&p0,&p1,IVar11,1.0);
      psVar20 = (keyPresses->
                super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      psVar18 = (keyPresses->
                super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      lVar17 = lVar17 + 0x30;
    }
    ImGui::SetCursorScreenPos(&savePos2);
    ImGui::PushItemWidth(100.0);
    if (stateUI->recording == false) {
      if (stateUI->audioCapture == true) {
        tview.samples = (short *)0x0;
        bVar10 = ImGui::Button("   Record",(ImVec2 *)&tview);
        if ((bVar10) &&
           ((ulong)((long)(stateUI->waveformInput).super__Vector_base<short,_std::allocator<short>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(stateUI->waveformInput).super__Vector_base<short,_std::allocator<short>_>.
                         _M_impl.super__Vector_impl_data._M_start) < 0x57e400)) {
          AudioLogger::resume(&audioLogger);
          stateUI->recording = true;
          LOCK();
          g_doRecord._M_base._M_i = (__atomic_base<bool>)true;
          UNLOCK();
        }
        IVar7 = ImGui::GetCursorScreenPos();
        p0 = IVar7;
        IVar8 = ImGui::CalcTextSize("  ",(char *)0x0,false,-1.0);
        local_e8 = IVar7.x;
        p1.x = IVar8.x * 0.9 + local_e8;
        fVar26 = ImGui::GetFrameHeightWithSpacing();
        fStack_e4 = IVar7.y;
        p1.y = fVar26 * -0.56 + fStack_e4;
        pIVar14 = ImGui::GetWindowDrawList();
        tview.samples = (short *)0x3f800000;
        tview.n = 0x3f80000000000000;
        IVar11 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)&tview);
        ImDrawList::AddCircleFilled(pIVar14,&p1,6.0,IVar11,0xc);
        ImGui::SetCursorScreenPos(&p0);
        ImGui::SameLine(0.0,-1.0);
      }
      ImGui::Checkbox("x0.5",&renderKeyPresses::playHalfSpeed);
      ImGui::SameLine(0.0,-1.0);
      if (g_playbackData.playing == true) {
        tview.samples = (short *)0x0;
        bVar10 = ImGui::Button("Stop",(ImVec2 *)&tview);
        if ((bVar10) ||
           ((bVar10 = ImGui::IsKeyPressed(0x2c,true), bVar10 &&
            (pIVar13 = ImGui::GetIO(), pIVar13->KeyCtrl != false)))) {
          g_playbackData.playing = false;
          g_playbackData.idx = g_playbackData.waveform.n + -0x400;
        }
      }
      else {
        tview.samples = (short *)0x0;
        bVar10 = ImGui::Button("Play",(ImVec2 *)&tview);
        if ((bVar10) ||
           ((bVar10 = ImGui::IsKeyPressed(0x2c,true), bVar10 &&
            (pIVar13 = ImGui::GetIO(), pIVar13->KeyCtrl != false)))) {
          g_playbackData.playing = true;
          g_playbackData.slowDown = renderKeyPresses::playHalfSpeed + 1;
          g_playbackData.idx = 0;
          g_playbackData.offset = (int64_t)*v_04;
          iVar12 = 160000;
          if (*v < 160000) {
            iVar12 = *v;
          }
          g_playbackData.waveform.samples =
               (waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
               super__Vector_impl_data._M_start + g_playbackData.offset;
          g_playbackData.waveform.n = (int64_t)iVar12;
          SDL_PauseAudioDevice(g_deviceIdOut,0);
        }
      }
      if (g_playbackData.waveform.n + -0x200 <= g_playbackData.idx) {
        g_playbackData.playing = false;
        SDL_ClearQueuedAudio(g_deviceIdOut);
        SDL_PauseAudioDevice(g_deviceIdOut,1);
      }
      ImGui::SameLine(0.0,-1.0);
      bVar10 = ImGui::SliderFloat("Threshold background",&renderKeyPresses::thresholdBackground,0.1,
                                  50.0,"%.3f",1.0);
      if (bVar10) {
        stateUI->recalculateKeyPresses = true;
      }
      ImGui::SameLine(0.0,-1.0);
      bVar10 = ImGui::SliderInt("History Size",&renderKeyPresses::historySizeReset,0x200,0x4000,"%d"
                               );
      if (bVar10) {
        stateUI->recalculateKeyPresses = true;
      }
      ImGui::SameLine(0.0,-1.0);
      tview.samples = (short *)0x0;
      bVar10 = ImGui::Button("Recalculate",(ImVec2 *)&tview);
      if (bVar10) {
        stateUI->recalculateKeyPresses = true;
      }
      ImGui::SameLine(0.0,-1.0);
      ImGui::DragInt("Key width",v_03,8.0,0,0x640,"%d");
      ImGui::SameLine(0.0,-1.0);
      ImGui::DragInt("Peak offset",v_02,8.0,-0x640,0x640,"%d");
      ImGui::SameLine(0.0,-1.0);
      ImGui::DragInt("Align window",&(stateUI->params).alignWindow_samples,8.0,0,0x640,"%d");
      ImGui::PopItemWidth();
    }
    else {
      if (((byte)g_doRecord._M_base._M_i & 1) != 0) {
        LOCK();
        g_doRecord._M_base._M_i = (__atomic_base<bool>)false;
        UNLOCK();
        AudioLogger::record(&audioLogger,0.2,0);
      }
      tview.samples = (short *)0x0;
      bVar10 = ImGui::Button("   Stop Recording",(ImVec2 *)&tview);
      if (bVar10) {
        AudioLogger::pause(&audioLogger);
        LOCK();
        g_doRecord._M_base._M_i = (__atomic_base<bool>)false;
        UNLOCK();
        stateUI->recalculateKeyPresses = true;
        stateUI->lastSize = stateUI->lastSize + -1;
        stateUI->recording = false;
        stateUI->findBestCutoffFreq = true;
        stateUI->rescaleWaveform = true;
      }
      IVar7 = ImGui::GetCursorScreenPos();
      p0 = IVar7;
      IVar8 = ImGui::CalcTextSize("  ",(char *)0x0,false,-1.0);
      local_e8 = IVar7.x;
      p1.x = IVar8.x * 0.9 + local_e8;
      fVar26 = ImGui::GetFrameHeightWithSpacing();
      fStack_e4 = IVar7.y;
      fStack_e4 = fVar26 * -0.56 + fStack_e4;
      IVar28.x = p1.x + -4.0;
      IVar28.y = fStack_e4 + -4.0;
      local_90.x = p1.x + 4.0;
      local_90.y = fStack_e4 + 4.0;
      p1 = IVar28;
      pIVar14 = ImGui::GetWindowDrawList();
      tview.samples = (short *)0x3f8000003f800000;
      tview.n = 0x3f8000003f800000;
      IVar11 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)&tview);
      ImDrawList::AddRectFilled(pIVar14,&p1,&local_90,IVar11,0.0,0xf);
      ImGui::SetCursorScreenPos(&p0);
      ImGui::SameLine(0.0,-1.0);
      ImGui::Text("Record length: %4.2f s (max : %4.2f s)",
                  SUB84((double)((float)(ulong)((long)(stateUI->waveformInput).
                                                                                                            
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                (long)(stateUI->waveformInput).
                                                                                                            
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_start >> 1) /
                                16000.0),0),0x4066800000000000);
    }
    if (stateUI->recalculateKeyPresses == true) {
      tview.samples =
           (waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
           super__Vector_impl_data._M_start;
      tview.n = (long)(waveform->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)tview.samples >> 1;
      findKeyPresses<short>
                (&tview,keyPresses,&stateUI->waveformThreshold,&stateUI->waveformMax,
                 (double)renderKeyPresses::thresholdBackground,0x200,
                 renderKeyPresses::historySizeReset,true);
      stateUI->recalculateKeyPresses = false;
    }
    fVar26 = ImGui::GetWindowHeight();
  }
  else {
    fVar26 = ImGui::GetTextLineHeightWithSpacing();
  }
  stateUI->windowHeightKeyPesses = fVar26;
  ImGui::End();
  return false;
}

Assistant:

bool renderKeyPresses(stStateUI & stateUI, const TWaveform & waveform, TKeyPressCollection & keyPresses) {
    auto & params = stateUI.params;

    bool & scrolling = stateUI.scrolling;
    bool & recalculateKeyPresses = stateUI.recalculateKeyPresses;

    int & nview = stateUI.nview;
    int & viewMin = stateUI.viewMin;
    int & viewMax = stateUI.viewMax;
    int & offset = stateUI.offset;
    int & lastSize = stateUI.lastSize;
    int & lastKeyPresses = stateUI.lastKeyPresses;

    float & amin = stateUI.amin;
    float & amax = stateUI.amax;

    float & dragOffset = stateUI.dragOffset;
    float & scrollSize = stateUI.scrollSize;

    auto & nviewPrev = stateUI.nviewPrev;

    TWaveform & waveformLowRes = stateUI.waveformLowRes;
    TWaveform & waveformThreshold = stateUI.waveformThreshold;
    TWaveform & waveformMax = stateUI.waveformMax;

    if (nview < 0) nview = waveform.size();
    if (offset < 0) offset = (waveform.size() - nview)/2;

    if (stateUI.recording) {
        if (nview < 1024*kSamplesPerFrame && scrolling == false) {
            nview = std::min((int) (1024*kSamplesPerFrame), (int) waveform.size());
        }
    }

    if (lastSize != (int) waveform.size()) {
        viewMax = waveform.size();
        lastSize = waveform.size();
        nviewPrev = nview + 1;

        if (scrolling == false) {
            offset = waveform.size() - nview;
        }
    }

#if 0
    if ((int) keyPresses.size() >= lastKeyPresses + 10) {
        lastKeyPresses = keyPresses.size();

        stateUI.similarityMap.clear();
        stateUI.flags.recalculateSimilarityMap = true;
        stateUI.doUpdate = true;
    }
#endif

    ImGui::SetNextWindowPos(ImVec2(0, stateUI.windowHeightTitleBar), ImGuiCond_Once);
    if (stateUI.windowHeightKeyPesses == 0.0f) {
        ImGui::SetNextWindowSize(ImVec2(g_windowSizeX, 250.0f), ImGuiCond_Always);
    } else {
        ImGui::SetNextWindowSize(ImVec2(g_windowSizeX, stateUI.windowHeightKeyPesses), ImGuiCond_Always);
    }
    if (ImGui::Begin("Key Presses", nullptr, ImGuiWindowFlags_NoMove)) {
        bool ignoreDelete = false;

        auto wsize = ImVec2(ImGui::GetContentRegionAvailWidth(), ImGui::GetContentRegionAvail().y - 3*ImGui::GetTextLineHeightWithSpacing());

        if (nview != nviewPrev) {
            generateLowResWaveform(waveform, waveformLowRes, std::max(1.0f, nview/wsize.x));
            nviewPrev = nview;
        }

        auto wview = getView(waveformLowRes, offset, nview);

        auto mpos = ImGui::GetIO().MousePos;
        auto savePos = ImGui::GetCursorScreenPos();
        auto drawList = ImGui::GetWindowDrawList();
        ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.3f, 0.3f, 0.3f, 0.3f });
        ImGui::PushStyleColor(ImGuiCol_PlotHistogram, { 1.0f, 1.0f, 1.0f, 1.0f });
        ImGui::PlotHistogram("##Waveform", plotWaveform, &wview, nview, 0, "Waveform", amin, amax, wsize);
        ImGui::PopStyleColor(2);
        ImGui::SetCursorScreenPos(savePos);
        ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.1f, 0.1f, 0.1f, 0.0f });
        ImGui::PushStyleColor(ImGuiCol_PlotHistogram, { 1.0f, 1.0f, 1.0f, 1.0f });
        ImGui::PlotHistogram("##Waveform", plotWaveformInverse, &wview, nview, 0, "Waveform", amin, amax, wsize);
        ImGui::PopStyleColor(2);

        if (waveform.size() == waveformThreshold.size() && waveform.size() == waveformMax.size()) {
            auto tview = getView(waveformThreshold, offset, nview);
            auto mview = getView(waveformMax, offset, nview);

            ImGui::SetCursorScreenPos(savePos);
            ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.0f, 0.0f, 0.0f, 0.0f });
            ImGui::PushStyleColor(ImGuiCol_PlotLines, { 1.0f, 1.0f, 0.0f, 0.5f });
            ImGui::PlotLines("##WaveformThreshold", plotWaveform, &tview, nview, 0, "", amin, amax, wsize);
            ImGui::PopStyleColor(2);
            ImGui::SetCursorScreenPos(savePos);
            ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.0f, 0.0f, 0.0f, 0.0f });
            ImGui::PushStyleColor(ImGuiCol_PlotLines, { 1.0f, 1.0f, 0.0f, 0.5f });
            ImGui::PlotLines("##WaveformThreshold", plotWaveformInverse, &tview, nview, 0, "", amin, amax, wsize);
            ImGui::PopStyleColor(2);
            ImGui::SetCursorScreenPos(savePos);
            ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.0f, 0.0f, 0.0f, 0.0f });
            ImGui::PushStyleColor(ImGuiCol_PlotLines, { 0.0f, 1.0f, 0.0f, 0.5f });
            ImGui::PlotLines("##WaveformMax", plotWaveform, &mview, nview, 0, "", amin, amax, wsize);
            ImGui::PopStyleColor(2);
            ImGui::SetCursorScreenPos(savePos);
            ImGui::PushStyleColor(ImGuiCol_FrameBg, { 0.0f, 0.0f, 0.0f, 0.0f });
            ImGui::PushStyleColor(ImGuiCol_PlotLines, { 0.0f, 1.0f, 0.0f, 0.5f });
            ImGui::PlotLines("##WaveformMax", plotWaveformInverse, &mview, nview, 0, "", amin, amax, wsize);
            ImGui::PopStyleColor(2);
        }
        ImGui::SetCursorScreenPos(savePos);

        ImGui::InvisibleButton("##WaveformIB",wsize);
        if (ImGui::IsItemHovered()) {
            auto w = ImGui::GetIO().MouseWheel;
            auto nview_old = nview;
            nview *= (10.0 + w)/10.0;
            nview = std::min(std::max(viewMin, nview), viewMax);
            if (w != 0.0) {
                offset = std::max(0.0f, offset + ((mpos.x - savePos.x)/wsize.x)*(nview_old - nview));
            }

            if (ImGui::IsMouseDown(0) && ImGui::IsMouseDragging(0) == false) {
                dragOffset = offset;
            }

            if (ImGui::IsMouseDragging(0)) {
                offset = dragOffset - ImGui::GetMouseDragDelta(0).x*nview/wsize.x;
            }

            if ((ImGui::IsMouseReleased(0) && ImGui::GetIO().KeyCtrl) || ImGui::IsMouseDoubleClicked(0)) {
                int i = 0;
                int64_t pos = offset + nview*(mpos.x - savePos.x)/wsize.x;
                for (i = 0; i < (int) keyPresses.size(); ++i) {
                    int64_t p0 = keyPresses[i].pos + params.offsetFromPeak_samples - params.keyPressWidth_samples;
                    int64_t p1 = keyPresses[i].pos + params.offsetFromPeak_samples + params.keyPressWidth_samples;
                    int64_t pmin = std::min(std::min(keyPresses[i].pos, p0), p1);
                    int64_t pmax = std::max(std::max(keyPresses[i].pos, p0), p1);
                    if (pmin > pos) {
                        ignoreDelete = true;
                        TKeyPressData entry;
                        entry.pos = pos;
                        entry.waveform = getView(waveform, 0);
                        keyPresses.insert(keyPresses.begin() + i, entry);
                        break;
                    }
                    if (pos >= pmin && pos <= pmax) break;
                }
                if (i == (int) keyPresses.size() && ignoreDelete == false) {
                    ignoreDelete = true;
                    TKeyPressData entry;
                    entry.pos = pos;
                    entry.waveform = getView(waveform, 0);
                    keyPresses.push_back(entry);
                }
            }
        }
        if (ImGui::BeginPopupContextWindow()) {
            ImGui::SliderInt("View  ", &nview, viewMin, viewMax);
            ImGui::DragInt  ("Offset", &offset, 0.01*nview, 0, waveform.size() - nview);
            ImGui::SliderFloat("Amplitude Min", &amin, -32000, 0);
            ImGui::SliderFloat("Amplitude Max", &amax, 0, 32000);
            ImGui::EndPopup();
        }

        ImGui::InvisibleButton("##WaveformScrollIB", {wsize.x, scrollSize});
        drawList->AddRect({savePos.x, savePos.y + wsize.y}, {savePos.x + wsize.x, savePos.y + wsize.y + scrollSize}, ImGui::ColorConvertFloat4ToU32({1.0f, 1.0f, 1.0f, 1.0f}));
        drawList->AddRectFilled({savePos.x + wsize.x*(1.f*offset)/viewMax, savePos.y + wsize.y}, {savePos.x + wsize.x*(1.f*offset + nview)/viewMax, savePos.y + wsize.y + scrollSize}, ImGui::ColorConvertFloat4ToU32({1.0f, 1.0f, 1.0f, 1.0f}));

        auto savePos2 = ImGui::GetCursorScreenPos();

        if (ImGui::IsItemHovered()) {
            if (ImGui::IsMouseDown(0)) {
                scrolling = true;
            }
        }

        if (scrolling) {
            offset = ((mpos.x - savePos.x)/wsize.x)*viewMax - nview/2;
        }

        if (ImGui::IsMouseDown(0) == false) {
            scrolling = false;
        }

        offset = std::max(0, std::min((int) offset, (int) waveform.size() - nview));
        for (int i = 0; i < (int) keyPresses.size(); ++i) {
            if (keyPresses[i].pos + params.offsetFromPeak_samples + params.keyPressWidth_samples < offset) continue;
            if (keyPresses[i].pos + params.offsetFromPeak_samples - params.keyPressWidth_samples >= offset + nview) break;

            {
                float x0 = ((float)(keyPresses[i].pos - offset))/nview;

                ImVec2 p0 = { savePos.x + x0*wsize.x, savePos.y };
                ImVec2 p1 = { savePos.x + x0*wsize.x, savePos.y + wsize.y };

                drawList->AddLine(p0, p1, ImGui::ColorConvertFloat4ToU32({ 1.0f, 0.0f, 0.0f, 0.8f }), 1.0f);
            }

            {
                float x0 = ((float)(keyPresses[i].pos - offset))/nview;
                float x1 = ((float)(keyPresses[i].pos + params.offsetFromPeak_samples - params.keyPressWidth_samples - offset))/nview;
                float x2 = ((float)(keyPresses[i].pos + params.offsetFromPeak_samples + params.keyPressWidth_samples - offset))/nview;

                ImVec2 p0 = { savePos.x + x0*wsize.x, savePos.y };
                ImVec2 p1 = { savePos.x + x1*wsize.x, savePos.y };
                ImVec2 p2 = { savePos.x + x2*wsize.x, savePos.y + wsize.y };

                float xmin = std::min(std::min(p0.x, p1.x), p2.x);
                float xmax = std::max(std::max(p0.x, p1.x), p2.x);

                bool isHovered = (mpos.x > xmin && mpos.x < xmax && mpos.y > p1.y && mpos.y < p2.y);

                float col = isHovered ? 0.7f : 0.3f;
                drawList->AddRectFilled(p1, p2, ImGui::ColorConvertFloat4ToU32({ 1.0f, 0.0f, 0.0f, col }));

                if (isHovered) {
                    if (((ImGui::IsMouseReleased(0) && ImGui::GetIO().KeyCtrl) || ImGui::IsMouseDoubleClicked(0)) && ignoreDelete == false) {
                        keyPresses.erase(keyPresses.begin() + i);
                        --i;
                    }
                }

                if (nview < 64.0*wsize.x) {
                    ImGui::SetCursorScreenPos({ savePos.x + 0.5f*((x1 + x2)*wsize.x - ImGui::CalcTextSize(std::to_string(i).c_str()).x), savePos.y + wsize.y - ImGui::GetTextLineHeightWithSpacing() });
                    ImGui::Text("%d", i);
                }

            }

            {
                float x0 = ((float)(g_playbackData.offset + g_playbackData.idx - offset))/nview;

                ImVec2 p0 = {savePos.x + x0*wsize.x, savePos.y};
                ImVec2 p1 = {savePos.x + x0*wsize.x, savePos.y + wsize.y};
                drawList->AddLine(p0, p1, ImGui::ColorConvertFloat4ToU32({ 1.0f, 1.0f, 0.0f, 0.3f }));
            }
        }
        for (int i = 0; i < (int) keyPresses.size(); ++i) {
            {
                float x0 = ((float)(keyPresses[i].pos))/viewMax;

                ImVec2 p0 = { savePos.x + x0*wsize.x, savePos.y + wsize.y };
                ImVec2 p1 = { savePos.x + x0*wsize.x, savePos.y + wsize.y + scrollSize };

                drawList->AddLine(p0, p1, ImGui::ColorConvertFloat4ToU32({ 1.0f, 0.0f, 0.0f, 0.3f }));
            }
        }

        ImGui::SetCursorScreenPos(savePos2);

        //auto io = ImGui::GetIO();
        //ImGui::Text("Keys pressed:");   for (int i = 0; i < IM_ARRAYSIZE(io.KeysDown); i++) if (ImGui::IsKeyPressed(i))             { ImGui::SameLine(); ImGui::Text("%d", i); }

        static bool playHalfSpeed = false;
        static int historySizeReset = kFindKeysHistorySizeReset;
        static float thresholdBackground = kFindKeysThreshold;
        ImGui::PushItemWidth(100.0);

        if (stateUI.recording == false) {
            if (stateUI.audioCapture) {
                if (ImGui::Button("   Record")) {
                    if (float(stateUI.waveformInput.size()/kSampleRate) < kMaxRecordSize_s) {
                        audioLogger.resume();
                        stateUI.recording = true;
                        g_doRecord = true;
                    }
                }
                {
                    auto savePos = ImGui::GetCursorScreenPos();
                    auto p = savePos;
                    p.x += 0.90f*ImGui::CalcTextSize("  ").x;
                    p.y -= 0.56f*ImGui::GetFrameHeightWithSpacing();
                    ImGui::GetWindowDrawList()->AddCircleFilled(p, 6.0, ImGui::ColorConvertFloat4ToU32({ 1.0f, 0.0f, 0.0f, 1.0f }));
                    ImGui::SetCursorScreenPos(savePos);
                }

                ImGui::SameLine();
            }

            ImGui::Checkbox("x0.5", &playHalfSpeed);
            ImGui::SameLine();
            if (g_playbackData.playing) {
                if (ImGui::Button("Stop") || (ImGui::IsKeyPressed(44) && ImGui::GetIO().KeyCtrl)) { // Ctrl + space
                    g_playbackData.playing = false;
                    g_playbackData.idx = g_playbackData.waveform.n - TPlaybackData::kSamples;
                }
            } else {
                if (ImGui::Button("Play") || (ImGui::IsKeyPressed(44) && ImGui::GetIO().KeyCtrl)) { // Ctrl + space
                    g_playbackData.playing = true;
                    g_playbackData.slowDown = playHalfSpeed ? 2 : 1;
                    g_playbackData.idx = 0;
                    g_playbackData.offset = offset;
                    g_playbackData.waveform = getView(waveform, offset, std::min((int) (10*kSampleRate), nview));
                    SDL_PauseAudioDevice(g_deviceIdOut, 0);
                }
            }

            if (g_playbackData.idx >= g_playbackData.waveform.n - kSamplesPerFrame) {
                g_playbackData.playing = false;
                SDL_ClearQueuedAudio(g_deviceIdOut);
#ifndef __EMSCRIPTEN__
                SDL_PauseAudioDevice(g_deviceIdOut, 1);
#endif
            }

            ImGui::SameLine();
            ImGui::SliderFloat("Threshold background", &thresholdBackground, 0.1f, 50.0f) && (recalculateKeyPresses = true);
            ImGui::SameLine();
            ImGui::SliderInt("History Size", &historySizeReset, 512, 1024*16) && (recalculateKeyPresses = true);
            ImGui::SameLine();
            if (ImGui::Button("Recalculate")) {
                recalculateKeyPresses = true;
            }

            ImGui::SameLine();
            ImGui::DragInt("Key width", &params.keyPressWidth_samples, 8, 0, kSampleRate/10);
            ImGui::SameLine();
            ImGui::DragInt("Peak offset", &params.offsetFromPeak_samples, 8, -kSampleRate/10, kSampleRate/10);
            ImGui::SameLine();
            ImGui::DragInt("Align window", &params.alignWindow_samples, 8, 0, kSampleRate/10);

            ImGui::PopItemWidth();
        } else {
            if (g_doRecord) {
                g_doRecord = false;
                audioLogger.record(0.2f, 0);
            }

            if (ImGui::Button("   Stop Recording")) {
                audioLogger.pause();
                g_doRecord = false;

                stateUI.recalculateKeyPresses = true;
                stateUI.lastSize = stateUI.lastSize - 1;
                stateUI.recording = false;
                stateUI.findBestCutoffFreq = true;
                stateUI.rescaleWaveform = true;
            }
            {
                auto savePos = ImGui::GetCursorScreenPos();
                auto p0 = savePos;
                p0.x += 0.90f*ImGui::CalcTextSize("  ").x;
                p0.y -= 0.56f*ImGui::GetFrameHeightWithSpacing();

                auto p1 = p0;
                p0.x -= 4.0f;
                p0.y -= 4.0f;
                p1.x += 4.0f;
                p1.y += 4.0f;

                ImGui::GetWindowDrawList()->AddRectFilled(p0, p1, ImGui::ColorConvertFloat4ToU32({ 1.0f, 1.0f, 1.0f, 1.0f }));
                ImGui::SetCursorScreenPos(savePos);
            }

            ImGui::SameLine();
            ImGui::Text("Record length: %4.2f s (max : %4.2f s)", (float)(stateUI.waveformInput.size())/kSampleRate, kMaxRecordSize_s);
        }

        if (recalculateKeyPresses) {
            findKeyPresses(getView(waveform, 0), keyPresses, waveformThreshold, waveformMax, thresholdBackground, kFindKeysHistorySize, historySizeReset, kFindKeysRemoveLowPower);
            recalculateKeyPresses = false;
        }

        stateUI.windowHeightKeyPesses = ImGui::GetWindowHeight();
    } else {
        stateUI.windowHeightKeyPesses = ImGui::GetTextLineHeightWithSpacing();
    }
    ImGui::End();

    return false;
}